

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff.cxx
# Opt level: O1

void __thiscall vigra::TIFFDecoderImpl::nextScanline(TIFFDecoderImpl *this)

{
  byte *pbVar1;
  TIFF *pTVar2;
  tdata_t pvVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  
  uVar4 = (this->super_TIFFCodecImpl).stripindex + 1;
  (this->super_TIFFCodecImpl).stripindex = uVar4;
  if ((this->super_TIFFCodecImpl).stripheight <= uVar4) {
    (this->super_TIFFCodecImpl).stripindex = 0;
    pTVar2 = (this->super_TIFFCodecImpl).tiff;
    if ((this->super_TIFFCodecImpl).planarconfig == 2) {
      TIFFScanlineSize();
      if ((this->super_TIFFCodecImpl).samples_per_pixel != 0) {
        uVar7 = 0;
        do {
          pTVar2 = (this->super_TIFFCodecImpl).tiff;
          pvVar3 = (this->super_TIFFCodecImpl).stripbuffer[uVar7];
          this->scanline = this->scanline + 1;
          TIFFReadScanline(pTVar2,pvVar3);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (this->super_TIFFCodecImpl).samples_per_pixel);
      }
    }
    else {
      pvVar3 = *(this->super_TIFFCodecImpl).stripbuffer;
      this->scanline = this->scanline + 1;
      TIFFReadScanline(pTVar2,pvVar3);
    }
    if ((((this->super_TIFFCodecImpl).photometric == 0) &&
        ((this->super_TIFFCodecImpl).samples_per_pixel == 1)) &&
       (iVar5 = std::__cxx11::string::compare((char *)this), iVar5 == 0)) {
      pvVar3 = *(this->super_TIFFCodecImpl).stripbuffer;
      iVar5 = TIFFScanlineSize((this->super_TIFFCodecImpl).tiff);
      if (iVar5 != 0) {
        lVar6 = 0;
        do {
          pbVar1 = (byte *)((long)pvVar3 + lVar6);
          *pbVar1 = ~*pbVar1;
          lVar6 = lVar6 + 1;
        } while (iVar5 != (int)lVar6);
      }
    }
  }
  return;
}

Assistant:

void TIFFDecoderImpl::nextScanline()
    {
        // eventually read a new strip
        if ( ++stripindex >= stripheight ) {
            stripindex = 0;

            if ( planarconfig == PLANARCONFIG_SEPARATE ) {
                const tsize_t size = TIFFScanlineSize(tiff);
                for( unsigned int i = 0; i < samples_per_pixel; ++i )
                    TIFFReadScanline(tiff, stripbuffer[i], scanline++, size);
            } else {
                TIFFReadScanline( tiff, stripbuffer[0], scanline++, 0);
            }

            // XXX handle bilevel images

            // invert grayscale images that interpret 0 as white
            if ( photometric == PHOTOMETRIC_MINISWHITE &&
                 samples_per_pixel == 1 && pixeltype == "UINT8" ) {

                UInt8 * buf = static_cast< UInt8 * >(stripbuffer[0]);
                const unsigned int n = TIFFScanlineSize(tiff);

                // invert every pixel
                for ( unsigned int i = 0; i < n; ++i, ++buf )
                    *buf = 0xff - *buf;
            }
        }
    }